

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::Marray<float,std::allocator<unsigned_long>>::
Marray<andres::BinaryViewExpressionScalarSecond<andres::View<float,true,std::allocator<unsigned_long>>,float,float,andres::marray_detail::Minus<float,float,float>>,float>
          (Marray<float,std::allocator<unsigned_long>> *this,
          ViewExpression<andres::BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>,_float>
          *expression,allocator_type *allocator)

{
  allocator_type *this_00;
  size_t sVar1;
  float *pfVar2;
  CoordinateOrder *pCVar3;
  size_t *begin;
  size_t *end;
  CoordinateOrder *internalCoordinateOrder;
  value_type vVar4;
  BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
  *e;
  Geometry<std::allocator<unsigned_long>_> local_b0;
  allocator<unsigned_long> local_71;
  Geometry<std::allocator<unsigned_long>_> local_70;
  allocator<float> local_21;
  allocator_type *local_20;
  allocator_type *allocator_local;
  ViewExpression<andres::BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>,_float>
  *expression_local;
  Marray<float,_std::allocator<unsigned_long>_> *this_local;
  
  local_20 = allocator;
  allocator_local = (allocator_type *)expression;
  expression_local =
       (ViewExpression<andres::BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>,_float>
        *)this;
  std::allocator<float>::allocator(&local_21);
  View<float,_false,_std::allocator<unsigned_long>_>::View
            ((View<float,_false,_std::allocator<unsigned_long>_> *)this,&local_21);
  std::allocator<float>::~allocator(&local_21);
  std::allocator<float>::allocator((allocator<float> *)(this + 0x40),local_20);
  sVar1 = ViewExpression<andres::BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>,_float>
          ::size((ViewExpression<andres::BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>,_float>
                  *)allocator_local);
  pfVar2 = __gnu_cxx::new_allocator<float>::allocate
                     ((new_allocator<float> *)(this + 0x40),sVar1,(void *)0x0);
  *(float **)this = pfVar2;
  sVar1 = ViewExpression<andres::BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>,_float>
          ::dimension((ViewExpression<andres::BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>,_float>
                       *)allocator_local);
  if (sVar1 == 0) {
    pCVar3 = BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
             ::coordinateOrder((BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
                                *)allocator_local);
    std::allocator<unsigned_long>::allocator<float>(&local_71,(allocator<float> *)(this + 0x40));
    marray_detail::Geometry<std::allocator<unsigned_long>_>::Geometry
              (&local_70,0,pCVar3,1,true,&local_71);
    marray_detail::Geometry<std::allocator<unsigned_long>_>::operator=
              ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),&local_70);
    marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&local_70);
    std::allocator<unsigned_long>::~allocator(&local_71);
  }
  else {
    begin = BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
            ::shapeBegin((BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
                          *)allocator_local);
    end = BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
          ::shapeEnd((BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
                      *)allocator_local);
    pCVar3 = BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
             ::coordinateOrder((BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
                                *)allocator_local);
    internalCoordinateOrder =
         BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
         ::coordinateOrder((BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
                            *)allocator_local);
    std::allocator<unsigned_long>::allocator<float>
              ((allocator<unsigned_long> *)((long)&e + 7),(allocator<float> *)(this + 0x40));
    marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long_const*>
              ((Geometry<std::allocator<unsigned_long>> *)&local_b0,begin,end,pCVar3,
               internalCoordinateOrder,(allocator<unsigned_long> *)((long)&e + 7));
    marray_detail::Geometry<std::allocator<unsigned_long>_>::operator=
              ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),&local_b0);
    marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&local_b0);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&e + 7));
  }
  this_00 = allocator_local;
  sVar1 = BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
          ::dimension((BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
                       *)allocator_local);
  if (sVar1 == 0) {
    sVar1 = BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
            ::size((BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
                    *)this_00);
    marray_detail::Assert<bool>(sVar1 < 2);
    vVar4 = BinaryViewExpressionScalarSecond<andres::View<float,true,std::allocator<unsigned_long>>,float,float,andres::marray_detail::Minus<float,float,float>>
            ::operator()((BinaryViewExpressionScalarSecond<andres::View<float,true,std::allocator<unsigned_long>>,float,float,andres::marray_detail::Minus<float,float,float>>
                          *)this_00,0);
    **(value_type **)this = vVar4;
  }
  else {
    sVar1 = BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
            ::size((BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
                    *)this_00);
    marray_detail::Assert<bool>(sVar1 != 0);
    marray_detail::
    operate<andres::marray_detail::Assign<float,float>,float,std::allocator<unsigned_long>,andres::BinaryViewExpressionScalarSecond<andres::View<float,true,std::allocator<unsigned_long>>,float,float,andres::marray_detail::Minus<float,float,float>>,float>
              (this,this_00);
  }
  Marray<float,_std::allocator<unsigned_long>_>::testInvariant
            ((Marray<float,_std::allocator<unsigned_long>_> *)this);
  return;
}

Assistant:

inline
Marray<T, A>::Marray
(
    const ViewExpression<E, Te>& expression,
    const allocator_type& allocator
) 
:   dataAllocator_(allocator)
{
    this->data_ = dataAllocator_.allocate(expression.size());
    if(expression.dimension() == 0) {
        this->geometry_ = geometry_type(0, 
            static_cast<const E&>(expression).coordinateOrder(), 
            1, true, dataAllocator_);
    }
    else {
        this->geometry_ = geometry_type(
            static_cast<const E&>(expression).shapeBegin(), 
            static_cast<const E&>(expression).shapeEnd(),
            static_cast<const E&>(expression).coordinateOrder(),
            static_cast<const E&>(expression).coordinateOrder(),
            dataAllocator_);

    }
    const E& e = static_cast<const E&>(expression);
    if(e.dimension() == 0) {
        marray_detail::Assert(MARRAY_NO_ARG_TEST || e.size() < 2);
        this->data_[0] = static_cast<T>(e(0));
    }
    else {
        marray_detail::Assert(MARRAY_NO_ARG_TEST || e.size() != 0);
        marray_detail::operate(*this, e, marray_detail::Assign<T, Te>());
    }
    testInvariant();
}